

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corr.cpp
# Opt level: O0

AggregateFunction * duckdb::CorrFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  LogicalType *in_stack_000000a8;
  LogicalType *in_stack_000000b0;
  LogicalType *in_stack_000000b8;
  LogicalType local_60 [40];
  LogicalType local_38 [24];
  LogicalType local_20 [32];
  
  duckdb::LogicalType::LogicalType(local_20,DOUBLE);
  duckdb::LogicalType::LogicalType(local_38,DOUBLE);
  duckdb::LogicalType::LogicalType(local_60,DOUBLE);
  AggregateFunction::
  BinaryAggregate<duckdb::CorrState,double,double,double,duckdb::CorrOperation,(duckdb::AggregateDestructorType)0>
            (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
  duckdb::LogicalType::~LogicalType(local_60);
  duckdb::LogicalType::~LogicalType(local_38);
  duckdb::LogicalType::~LogicalType(local_20);
  return in_RDI;
}

Assistant:

AggregateFunction CorrFun::GetFunction() {
	return AggregateFunction::BinaryAggregate<CorrState, double, double, double, CorrOperation>(
	    LogicalType::DOUBLE, LogicalType::DOUBLE, LogicalType::DOUBLE);
}